

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content-parser.c
# Opt level: O2

char * blogc_slugify(char *str)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  
  if (str != (char *)0x0) {
    pbVar2 = (byte *)bc_strdup(str);
    for (pbVar3 = pbVar2; bVar1 = *pbVar3, bVar1 != 0; pbVar3 = pbVar3 + 1) {
      if (9 < (byte)(bVar1 - 0x30) && 0x19 < (byte)(bVar1 + 0x9f)) {
        bVar4 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar4 = 0x2d;
        }
        *pbVar3 = bVar4;
      }
    }
    return (char *)pbVar2;
  }
  return (char *)0x0;
}

Assistant:

char*
blogc_slugify(const char *str)
{
    if (str == NULL)
        return NULL;
    char *new_str = bc_strdup(str);
    int diff = 'a' - 'A';  // just to avoid magic numbers
    for (size_t i = 0; new_str[i] != '\0'; i++) {
        if (new_str[i] >= 'a' && new_str[i] <= 'z')
            continue;
        if (new_str[i] >= '0' && new_str[i] <= '9')
            continue;
        if (new_str[i] >= 'A' && new_str[i] <= 'Z')
            new_str[i] += diff;
        else
            new_str[i] = '-';
    }
    return new_str;
}